

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phone.cpp
# Opt level: O2

void __thiscall state_machine::Phone::Phone(Phone *this)

{
  _Rb_tree_header *p_Var1;
  vector<std::pair<state_machine::Phone::Action,state_machine::Phone::State>,std::allocator<std::pair<state_machine::Phone::Action,state_machine::Phone::State>>>
  *pvVar2;
  key_type local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined1 local_18 [8];
  
  (this->m_rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_rules)._M_t._M_impl.super__Rb_tree_header;
  (this->m_rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_rules)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2c = on_hook;
  this->m_current_state = on_hook;
  local_28 = 0;
  pvVar2 = (vector<std::pair<state_machine::Phone::Action,state_machine::Phone::State>,std::allocator<std::pair<state_machine::Phone::Action,state_machine::Phone::State>>>
            *)std::
              map<state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>,_std::less<state_machine::Phone::State>,_std::allocator<std::pair<const_state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>_>_>_>
              ::operator[](&this->m_rules,&local_2c);
  std::
  vector<std::pair<state_machine::Phone::Action,state_machine::Phone::State>,std::allocator<std::pair<state_machine::Phone::Action,state_machine::Phone::State>>>
  ::_M_assign_aux<std::pair<state_machine::Phone::Action,state_machine::Phone::State>const*>
            (pvVar2,&local_28,&uStack_20);
  local_28 = 0x100000001;
  uStack_20 = 0x800000005;
  local_2c = off_hook;
  pvVar2 = (vector<std::pair<state_machine::Phone::Action,state_machine::Phone::State>,std::allocator<std::pair<state_machine::Phone::Action,state_machine::Phone::State>>>
            *)std::
              map<state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>,_std::less<state_machine::Phone::State>,_std::allocator<std::pair<const_state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>_>_>_>
              ::operator[](&this->m_rules,&local_2c);
  std::
  vector<std::pair<state_machine::Phone::Action,state_machine::Phone::State>,std::allocator<std::pair<state_machine::Phone::Action,state_machine::Phone::State>>>
  ::_M_assign_aux<std::pair<state_machine::Phone::Action,state_machine::Phone::State>const*>
            (pvVar2,&local_28,local_18);
  local_28 = 0x200000002;
  uStack_20 = 0x800000005;
  local_2c = dialing;
  pvVar2 = (vector<std::pair<state_machine::Phone::Action,state_machine::Phone::State>,std::allocator<std::pair<state_machine::Phone::Action,state_machine::Phone::State>>>
            *)std::
              map<state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>,_std::less<state_machine::Phone::State>,_std::allocator<std::pair<const_state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>_>_>_>
              ::operator[](&this->m_rules,&local_2c);
  std::
  vector<std::pair<state_machine::Phone::Action,state_machine::Phone::State>,std::allocator<std::pair<state_machine::Phone::Action,state_machine::Phone::State>>>
  ::_M_assign_aux<std::pair<state_machine::Phone::Action,state_machine::Phone::State>const*>
            (pvVar2,&local_28,local_18);
  local_28 = 0x500000003;
  uStack_20 = 0x600000005;
  local_2c = connected;
  pvVar2 = (vector<std::pair<state_machine::Phone::Action,state_machine::Phone::State>,std::allocator<std::pair<state_machine::Phone::Action,state_machine::Phone::State>>>
            *)std::
              map<state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>,_std::less<state_machine::Phone::State>,_std::allocator<std::pair<const_state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>_>_>_>
              ::operator[](&this->m_rules,&local_2c);
  std::
  vector<std::pair<state_machine::Phone::Action,state_machine::Phone::State>,std::allocator<std::pair<state_machine::Phone::Action,state_machine::Phone::State>>>
  ::_M_assign_aux<std::pair<state_machine::Phone::Action,state_machine::Phone::State>const*>
            (pvVar2,&local_28,local_18);
  local_28 = 0x400000004;
  uStack_20 = 0x600000005;
  local_2c = on_hold;
  pvVar2 = (vector<std::pair<state_machine::Phone::Action,state_machine::Phone::State>,std::allocator<std::pair<state_machine::Phone::Action,state_machine::Phone::State>>>
            *)std::
              map<state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>,_std::less<state_machine::Phone::State>,_std::allocator<std::pair<const_state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>_>_>_>
              ::operator[](&this->m_rules,&local_2c);
  std::
  vector<std::pair<state_machine::Phone::Action,state_machine::Phone::State>,std::allocator<std::pair<state_machine::Phone::Action,state_machine::Phone::State>>>
  ::_M_assign_aux<std::pair<state_machine::Phone::Action,state_machine::Phone::State>const*>
            (pvVar2,&local_28,local_18);
  local_28 = 0x800000005;
  local_2c = disconnected;
  pvVar2 = (vector<std::pair<state_machine::Phone::Action,state_machine::Phone::State>,std::allocator<std::pair<state_machine::Phone::Action,state_machine::Phone::State>>>
            *)std::
              map<state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>,_std::less<state_machine::Phone::State>,_std::allocator<std::pair<const_state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>_>_>_>
              ::operator[](&this->m_rules,&local_2c);
  std::
  vector<std::pair<state_machine::Phone::Action,state_machine::Phone::State>,std::allocator<std::pair<state_machine::Phone::Action,state_machine::Phone::State>>>
  ::_M_assign_aux<std::pair<state_machine::Phone::Action,state_machine::Phone::State>const*>
            (pvVar2,&local_28,&uStack_20);
  return;
}

Assistant:

Phone::Phone() {
    m_rules[State::on_hook] = {
        {Action::take_off_hook, State::off_hook}};

    m_rules[State::off_hook] = {
        {Action::dialing, State::dialing},
        {Action::put_on_hook, State::on_hook}};

    m_rules[State::dialing] = {
        {Action::calling, State::connecting},
        {Action::put_on_hook, State::on_hook}};

    m_rules[State::connected] = {
        {Action::put_on_hold, State::on_hold},
        {Action::put_on_hook, State::disconnecting}};

    m_rules[State::on_hold] = {
        {Action::take_off_hold, State::connected},
        {Action::put_on_hook, State::disconnecting}};

    m_rules[State::disconnected] = {
        {Action::put_on_hook, State::on_hook}};
}